

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O1

void __thiscall
CGraphics_Threaded::ReadBackbuffer
          (CGraphics_Threaded *this,uchar **ppPixels,int x,int y,int w,int h)

{
  CCommandBuffer *pCVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  CScreenshotCommand Cmd;
  CImageInfo Image;
  CScreenshotCommand local_78;
  CImageInfo local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (ppPixels != (uchar **)0x0) {
    mem_zero(&local_50,0x18);
    local_78.super_CCommand.m_Cmd = 10;
    local_78.super_CCommand.m_pNext = (CCommand *)0x0;
    local_78.m_pImage = &local_50;
    local_78.m_X = x;
    local_78.m_Y = y;
    local_78.m_W = w;
    local_78.m_H = h;
    CCommandBuffer::AddCommand<CCommandBuffer::CScreenshotCommand>(this->m_pCommandBuffer,&local_78)
    ;
    (*this->m_pBackend->_vptr_IGraphicsBackend[0x11])(this->m_pBackend,this->m_pCommandBuffer);
    uVar2 = (ulong)this->m_CurrentCommandBuffer ^ 1;
    this->m_CurrentCommandBuffer = (uint)uVar2;
    pCVar1 = this->m_apCommandBuffers[uVar2];
    this->m_pCommandBuffer = pCVar1;
    (pCVar1->m_CmdBuffer).m_Used = 0;
    *(undefined8 *)&(pCVar1->m_DataBuffer).m_Used = 0;
    *(undefined8 *)((long)&pCVar1->m_pCmdBufferHead + 4) = 0;
    *(undefined4 *)((long)&pCVar1->m_pCmdBufferTail + 4) = 0;
    (**(code **)(*(long *)this + 0x150))(this);
    *ppPixels = (uchar *)local_50.m_pData;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::ReadBackbuffer(unsigned char **ppPixels, int x, int y, int w, int h)
{
	if(!ppPixels)
		return;

	// add swap command
	CImageInfo Image;
	mem_zero(&Image, sizeof(Image));

	CCommandBuffer::CScreenshotCommand Cmd;
	Cmd.m_pImage = &Image;
	Cmd.m_X = x; Cmd.m_Y = y;
	Cmd.m_W = w; Cmd.m_H = h;
	m_pCommandBuffer->AddCommand(Cmd);

	// kick the buffer and wait for the result
	KickCommandBuffer();
	WaitForIdle();

	*ppPixels = (unsigned char *)Image.m_pData; // take ownership!
}